

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_givexp(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  uint gain;
  int iVar2;
  char *pcVar3;
  CHAR_DATA *ch_00;
  char temp [4608];
  char arg2 [4608];
  char arg1 [4608];
  char acStack_3628 [4608];
  char local_2428 [4608];
  char local_1228 [4616];
  
  pcVar3 = one_argument(argument,local_1228);
  pcVar3 = one_argument(pcVar3,local_2428);
  if (*pcVar3 == '\0') {
    pcVar3 = "Syntax:   givexp <character> <# xp> <message they receive>\n\r";
  }
  else {
    ch_00 = get_char_world(ch,local_1228);
    if (ch_00 == (CHAR_DATA *)0x0) {
      pcVar3 = "You can\'t find them.\n\r";
    }
    else {
      bVar1 = is_number(local_2428);
      if (!bVar1) {
        do_givexp(ch,"");
        return;
      }
      gain = atoi(local_2428);
      if (((int)gain < 0xbb9) || (iVar2 = get_trust(ch), 0x37 < iVar2)) {
        bVar1 = str_cmp(pcVar3,"");
        if (bVar1) {
          sprintf(acStack_3628,"%s\n\r",pcVar3);
        }
        else {
          sprintf(acStack_3628,"You receive %d experience points for outstanding performance.\n\r",
                  (ulong)gain);
        }
        send_to_char(acStack_3628,ch_00);
        gain_exp(ch_00,gain);
        send_to_char("Ok.\n\r",ch);
        sprintf(acStack_3628,"Log added: %s receives %d experience from %s.\n\r",ch_00->name,
                (ulong)gain,ch->name);
        send_to_char(acStack_3628,ch);
        sprintf(acStack_3628,"AUTO: %s gave %d experience.\n\r",ch->true_name,(ulong)gain);
        add_history((CHAR_DATA *)0x0,ch_00,acStack_3628);
        return;
      }
      pcVar3 = "You may not give more than 3000 experience.\n\r";
    }
  }
  send_to_char(pcVar3,ch);
  return;
}

Assistant:

void do_givexp(CHAR_DATA *ch, char *argument)
{
	char arg1[MSL], arg2[MSL], temp[MSL];
	CHAR_DATA *victim;
	int xp;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);

	if (!*argument)
	{
		send_to_char("Syntax:   givexp <character> <# xp> <message they receive>\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("You can't find them.\n\r", ch);
		return;
	}

	if (!is_number(arg2))
	{
		do_givexp(ch, "");
		return;
	}

	xp = atoi(arg2);

	if (xp > 3000 && get_trust(ch) < 56)
	{
		send_to_char("You may not give more than 3000 experience.\n\r", ch);
		return;
	}

	if (!str_cmp(argument, ""))
		sprintf(temp, "You receive %d experience points for outstanding performance.\n\r", xp);
	else
		sprintf(temp, "%s\n\r", argument);

	send_to_char(temp, victim);
	gain_exp(victim, xp);

	send_to_char("Ok.\n\r", ch);

	sprintf(temp, "Log added: %s receives %d experience from %s.\n\r", victim->name, xp, ch->name);
	send_to_char(temp, ch);

	sprintf(temp, "AUTO: %s gave %d experience.\n\r", ch->true_name, xp);
	add_history(nullptr, victim, temp);
}